

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O1

void __thiscall luna::State::EraseMetatable(State *this,char *metatable_name)

{
  Table *this_00;
  Value nil;
  anon_union_8_9_8deb4486_for_Value_0 local_40;
  undefined4 local_38;
  anon_union_8_9_8deb4486_for_Value_0 local_30;
  undefined4 local_28;
  
  local_30.obj_ = (GCObject *)0x0;
  local_28 = 4;
  local_30.str_ = GetString(this,metatable_name);
  local_40.obj_ = (GCObject *)0x0;
  local_38 = 0;
  this_00 = GetMetatables(this);
  Table::SetValue(this_00,(Value *)&local_30,(Value *)&local_40);
  return;
}

Assistant:

void State::EraseMetatable(const char *metatable_name)
    {
        Value k;
        k.type_ = ValueT_String;
        k.str_ = GetString(metatable_name);

        Value nil;
        auto metatables = GetMetatables();
        metatables->SetValue(k, nil);
    }